

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

void freednsentry(void *freethis)

{
  Curl_dns_entry *dns;
  void *freethis_local;
  
  *(long *)((long)freethis + 0x10) = *(long *)((long)freethis + 0x10) + -1;
  if (*(long *)((long)freethis + 0x10) == 0) {
    Curl_freeaddrinfo(*freethis);
    (*Curl_cfree)(freethis);
  }
  return;
}

Assistant:

static void freednsentry(void *freethis)
{
  struct Curl_dns_entry *dns = (struct Curl_dns_entry *) freethis;
  DEBUGASSERT(dns && (dns->inuse>0));

  dns->inuse--;
  if(dns->inuse == 0) {
    Curl_freeaddrinfo(dns->addr);
    free(dns);
  }
}